

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O2

void __thiscall QTextMarkdownImporter::import(QTextMarkdownImporter *this,QString *markdown)

{
  char16_t **ppcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QTextDocument *this_00;
  QDebug *pQVar5;
  qsizetype qVar6;
  MD_CHAR *text;
  char *pcVar7;
  long from;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QArrayDataPointer<char16_t> local_100;
  char *local_e8;
  QDebug local_e0;
  QStringView local_d8;
  QArrayDataPointer<char> local_c8;
  char16_t *pcStack_b0;
  undefined1 local_a0 [8];
  QFont local_98;
  MD_PARSER local_88;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.abi_version = 0;
  local_88.flags =
       (this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
       super_QFlagsStorage<QTextMarkdownImporter::Feature>.i;
  local_88.enter_block = CbEnterBlock;
  local_88.leave_block = CbLeaveBlock;
  local_88.enter_span = CbEnterSpan;
  local_88.leave_span = CbLeaveSpan;
  local_88.text = CbText;
  local_88.debug_log = CbDebugLog;
  local_88.syntax = (_func_void *)0x0;
  this_00 = QTextCursor::document(&this->m_cursor);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultFont((QTextDocument *)local_48);
  iVar4 = QFont::pointSize((QFont *)local_48);
  this->m_paragraphMargin = (iVar4 * 2) / 3;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  iVar4 = QFont::pointSize((QFont *)local_48);
  if (iVar4 == -1) {
    iVar4 = QFont::pixelSize((QFont *)local_48);
    QFont::setPixelSize(&this->m_monoFont,iVar4);
  }
  else {
    iVar4 = QFont::pointSize((QFont *)local_48);
    QFont::setPointSize(&this->m_monoFont,iVar4);
  }
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_c8.d._0_4_ = 2;
    local_c8.d._4_4_ = 0;
    local_c8.ptr._0_4_ = 0;
    local_c8.ptr._4_4_ = 0;
    local_c8.size._0_4_ = 0;
    local_c8.size._4_4_ = 0;
    pcStack_b0 = (char16_t *)lcMD::category.name;
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)&local_d8,"default font");
    local_a0 = (undefined1  [8])pQVar5->stream;
    ppcVar1 = &(((QFontPrivate *)local_a0)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((Stream *)&local_100,(QFont *)local_a0);
    pQVar5 = QDebug::operator<<((QDebug *)&local_100,"mono font");
    local_98.d.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)pQVar5->stream;
    ppcVar1 = &(((QFontPrivate *)local_98.d.d.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((QDebug)&local_98.resolve_mask,&local_98);
    QDebug::~QDebug((QDebug *)&local_98.resolve_mask);
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)&local_100);
    QDebug::~QDebug((QDebug *)local_a0);
    QDebug::~QDebug((QDebug *)&local_d8);
  }
  local_d8.m_data = (markdown->d).ptr;
  local_d8.m_size = (markdown->d).size;
  if (((this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
       super_QFlagsStorage<QTextMarkdownImporter::Feature>.i & 0x100000) != 0) {
    local_c8.size._0_4_ = 0xaaaaaaaa;
    local_c8.size._4_4_ = 0xaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d._0_4_ = 0xaaaaaaaa;
    local_c8.d._4_4_ = 0xaaaaaaaa;
    local_c8.ptr._0_4_ = 0xaaaaaaaa;
    local_c8.ptr._4_4_ = 0xaaaaaaaa;
    local_100.d._0_4_ = (undefined4)local_d8.m_size;
    local_100.d._4_4_ = (undefined4)((ulong)local_d8.m_size >> 0x20);
    local_100.ptr._0_4_ = SUB84(local_d8.m_data,0);
    local_100.ptr._4_4_ = (undefined4)((ulong)local_d8.m_data >> 0x20);
    pcVar7 = "---\n";
    from = 4;
    s.m_data = "---\n";
    s.m_size = 4;
    bVar3 = QStringView::startsWith((QStringView *)&local_100,s,CaseSensitive);
    if (!bVar3) {
      pcVar7 = "---\r\n";
      from = 5;
      s_00.m_data = "---\r\n";
      s_00.m_size = 5;
      bVar3 = QStringView::startsWith((QStringView *)&local_100,s_00,CaseSensitive);
      if (!bVar3) goto LAB_0052b2bb;
    }
    s_01.m_data = pcVar7;
    s_01.m_size = from;
    qVar6 = QStringView::indexOf((QStringView *)&local_100,s_01,from,CaseSensitive);
    if ((-1 < qVar6) &&
       (lVar2 = CONCAT44(local_100.ptr._4_4_,local_100.ptr._0_4_),
       *(short *)(lVar2 + -2 + qVar6 * 2) == 10)) {
      local_c8.ptr = (char *)(lVar2 + from * 2);
      local_c8.size = CONCAT44(local_100.d._4_4_,local_100.d._0_4_) - (qVar6 + from);
      local_c8.d = (Data *)(qVar6 - from);
      pcStack_b0 = (char16_t *)(lVar2 + (qVar6 + from) * 2);
      if (local_c8.d != (Data *)0x0) {
        QStringView::toString((QString *)&local_100,(QStringView *)&local_c8);
        QTextDocument::setMetaInformation(this_00,FrontMatter,(QString *)&local_100);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
        lcMD();
        qVar6 = local_c8.size;
        if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
          local_100.d._0_4_ = 2;
          local_100.d._4_4_ = 0;
          local_100.ptr._0_4_ = 0;
          local_100.ptr._4_4_ = 0;
          local_100.size._0_4_ = 0;
          local_100.size._4_4_ = 0;
          local_e8 = lcMD::category.name;
          QMessageLogger::debug();
          pQVar5 = QDebug::operator<<(&local_e0,"extracted FrontMatter: size");
          QDebug::operator<<(pQVar5,(qint64)local_c8.d);
          QDebug::~QDebug(&local_e0);
          qVar6 = local_c8.size;
        }
        local_d8.m_size = qVar6;
        local_d8.m_data = pcStack_b0;
      }
    }
  }
LAB_0052b2bb:
  local_c8.size._0_4_ = 0xaaaaaaaa;
  local_c8.size._4_4_ = 0xaaaaaaaa;
  local_c8.d._0_4_ = 0xaaaaaaaa;
  local_c8.d._4_4_ = 0xaaaaaaaa;
  local_c8.ptr._0_4_ = 0xaaaaaaaa;
  local_c8.ptr._4_4_ = 0xaaaaaaaa;
  QStringView::toUtf8((QByteArray *)&local_c8,&local_d8);
  QTextCursor::beginEditBlock(&this->m_cursor);
  text = (MD_CHAR *)CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
  if (text == (MD_CHAR *)0x0) {
    text = (MD_CHAR *)&QByteArray::_empty;
  }
  md_parse(text,(MD_SIZE)local_c8.size,&local_88,this);
  QTextCursor::endEditBlock(&this->m_cursor);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  QFont::~QFont((QFont *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextMarkdownImporter::import(const QString &markdown)
{
    MD_PARSER callbacks = {
        0, // abi_version
        unsigned(m_features),
        &CbEnterBlock,
        &CbLeaveBlock,
        &CbEnterSpan,
        &CbLeaveSpan,
        &CbText,
        &CbDebugLog,
        nullptr // syntax
    };
    QTextDocument *doc = m_cursor.document();
    const auto defaultFont = doc->defaultFont();
    m_paragraphMargin = defaultFont.pointSize() * 2 / 3;
    doc->clear();
    if (defaultFont.pointSize() != -1)
        m_monoFont.setPointSize(defaultFont.pointSize());
    else
        m_monoFont.setPixelSize(defaultFont.pixelSize());
    qCDebug(lcMD) << "default font" << defaultFont << "mono font" << m_monoFont;
    QStringView md = markdown;

    if (m_features.testFlag(QTextMarkdownImporter::FeatureFrontMatter)) {
        if (const auto split = splitFrontMatter(md)) {
            doc->setMetaInformation(QTextDocument::FrontMatter, split.frontMatter.toString());
            qCDebug(lcMD) << "extracted FrontMatter: size" << split.frontMatter.size();
            md = split.rest;
        }
    }

    const auto mdUtf8 = md.toUtf8();
    m_cursor.beginEditBlock();
    md_parse(mdUtf8.constData(), MD_SIZE(mdUtf8.size()), &callbacks, this);
    m_cursor.endEditBlock();
}